

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O1

Client * __thiscall
kj::Function<capnproto_test::capnp::test::TestMembrane::Thing::Client_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/membrane-test.c++:221:17)>
::operator()(Client *__return_storage_ptr__,
            Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_membrane_test_c__:221:17)>
            *this)

{
  long *plVar1;
  WirePointer *pWVar2;
  undefined8 uVar3;
  CapTableBuilder *pCVar4;
  RequestHook *pRVar5;
  CapTableBuilder *__n;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  int in_R8D;
  Own<capnp::ClientHook,_std::nullptr_t> OVar6;
  Request<capnproto_test::capnp::test::TestMembrane::LoopbackParams,_capnproto_test::capnp::test::TestMembrane::LoopbackResults>
  req;
  char *pcVar7;
  char *pcVar8;
  undefined8 uVar9;
  undefined1 local_128 [16];
  long *local_118;
  WirePointer *local_110;
  undefined8 uStack_108;
  Disposer *local_100;
  PointerBuilder local_f8;
  undefined8 local_e0;
  short local_d4;
  undefined4 local_d0;
  undefined8 *local_c8;
  long *local_c0;
  undefined1 local_b8 [32];
  undefined8 local_98;
  Request<capnproto_test::capnp::test::TestMembrane::LoopbackParams,_capnproto_test::capnp::test::TestMembrane::LoopbackResults>
  local_90;
  SegmentBuilder *local_58;
  CapTableBuilder *local_50;
  undefined8 local_48;
  undefined4 local_40;
  Maybe<capnp::MessageSize> local_38;
  
  local_38.ptr.isSet = false;
  capnproto_test::capnp::test::TestMembrane::Client::loopbackRequest
            (&local_90,&((this->f).env)->membraned,&local_38);
  heap<capnp::_::(anonymous_namespace)::ThingImpl,char_const(&)[8]>
            ((kj *)&local_58,(char (*) [8])0x505a7f);
  __n = local_50;
  local_f8.segment = local_58;
  local_f8.capTable = (CapTableBuilder *)((long)local_50 + 0x18);
  if (local_50 == (CapTableBuilder *)0x0) {
    local_f8.capTable = (CapTableBuilder *)0x0;
  }
  local_50 = (CapTableBuilder *)0x0;
  OVar6 = capnp::Capability::Client::makeLocalClient
                    ((Client *)(local_128 + 8),
                     (Own<capnp::Capability::Server,_std::nullptr_t> *)&local_f8);
  pCVar4 = local_f8.capTable;
  if (local_f8.capTable != (CapTableBuilder *)0x0) {
    local_f8.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_f8.segment)->super_SegmentReader).arena)->_vptr_Arena)
              (local_f8.segment,
               (pCVar4->super_CapTableReader)._vptr_CapTableReader[-2] +
               (long)&(pCVar4->super_CapTableReader)._vptr_CapTableReader,OVar6.ptr);
  }
  local_128._0_8_ = &capnproto_test::capnp::test::TestMembrane::Thing::Client::typeinfo;
  local_f8.segment = local_90.super_Builder._builder.segment;
  local_f8.capTable = local_90.super_Builder._builder.capTable;
  local_f8.pointer = local_90.super_Builder._builder.pointers;
  capnp::_::PointerBuilder::setCapability
            (&local_f8,(Own<capnp::ClientHook,_std::nullptr_t> *)(local_128 + 8));
  plVar1 = local_118;
  __buf = extraout_RDX;
  if (local_118 != (long *)0x0) {
    local_118 = (long *)0x0;
    (**((CapTableReader *)local_128._8_8_)->_vptr_CapTableReader)
              (local_128._8_8_,(long)plVar1 + *(long *)(*plVar1 + -0x10));
    __buf = extraout_RDX_00;
  }
  capnp::
  Request<capnproto_test::capnp::test::TestMembrane::LoopbackParams,_capnproto_test::capnp::test::TestMembrane::LoopbackResults>
  ::send((Request<capnproto_test::capnp::test::TestMembrane::LoopbackParams,_capnproto_test::capnp::test::TestMembrane::LoopbackResults>
          *)local_128,(int)&local_90,__buf,(size_t)__n,in_R8D);
  local_b8._16_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/membrane-test.c++"
  ;
  local_b8._24_8_ = "operator()";
  local_98 = 0xc000000e0;
  uVar9 = 0xc000000e0;
  pcVar7 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/membrane-test.c++"
  ;
  pcVar8 = "operator()";
  Promise<capnp::Response<capnproto_test::capnp::test::TestMembrane::LoopbackResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestMembrane::LoopbackResults>_>
              *)&local_f8,local_128);
  local_50 = local_f8.capTable;
  local_58 = local_f8.segment;
  if (local_d4 == 0) {
    local_d0 = 0x7fffffff;
    local_e0 = 0;
    local_50 = (CapTableBuilder *)0x0;
    local_58 = (SegmentBuilder *)0x0;
  }
  local_48 = local_e0;
  local_40 = local_d0;
  OVar6 = capnp::_::PointerReader::getCapability((PointerReader *)local_b8);
  plVar1 = local_c0;
  *(undefined8 *)&__return_storage_ptr__->field_0x8 = local_b8._0_8_;
  *(undefined8 *)&__return_storage_ptr__->field_0x10 = local_b8._8_8_;
  local_b8._8_8_ = (CapTableReader *)0x0;
  __return_storage_ptr__->_vptr_Client =
       (_func_int **)&capnproto_test::capnp::test::TestMembrane::Thing::Client::typeinfo;
  if (local_c0 != (long *)0x0) {
    local_c0 = (long *)0x0;
    (**(code **)*local_c8)(local_c8,(long)plVar1 + *(long *)(*plVar1 + -0x10),OVar6.ptr);
  }
  uVar3 = uStack_108;
  pWVar2 = local_110;
  if (local_110 != (WirePointer *)0x0) {
    local_110 = (WirePointer *)0x0;
    uStack_108._0_4_ = 0;
    uStack_108._4_2_ = 0;
    uStack_108._6_2_ = 0;
    (**local_100->_vptr_Disposer)(local_100,pWVar2,8,uVar3,uVar3,0,pcVar7,pcVar8,uVar9);
  }
  plVar1 = local_118;
  if (local_118 != (long *)0x0) {
    local_118 = (long *)0x0;
    (**((CapTableReader *)local_128._8_8_)->_vptr_CapTableReader)
              (local_128._8_8_,(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  uVar9 = local_128._0_8_;
  if ((SegmentBuilder *)local_128._0_8_ != (SegmentBuilder *)0x0) {
    local_128._0_8_ = (SegmentBuilder *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar9);
  }
  pRVar5 = local_90.hook.ptr;
  if (local_90.hook.ptr != (RequestHook *)0x0) {
    local_90.hook.ptr = (RequestHook *)0x0;
    (**(local_90.hook.disposer)->_vptr_Disposer)
              (local_90.hook.disposer,
               (_func_int *)((long)&pRVar5->_vptr_RequestHook + (long)pRVar5->_vptr_RequestHook[-2])
              );
  }
  return __return_storage_ptr__;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }